

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *unaff_R15;
  
  iVar3 = (this->max_height_).super___atomic_base<int>._M_i + -1;
  pNVar4 = this->head_;
  do {
    pNVar5 = pNVar4->next_[iVar3]._M_b._M_p;
    if (pNVar5 == (Node *)0x0) {
LAB_00112694:
      pNVar5 = pNVar4;
      if (iVar3 == 0) {
        iVar3 = 0;
        bVar1 = false;
        unaff_R15 = pNVar4;
      }
      else {
        iVar3 = iVar3 + -1;
        bVar1 = true;
      }
    }
    else {
      iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar5->key,*key);
      if (-1 < iVar2) goto LAB_00112694;
      bVar1 = true;
    }
    pNVar4 = pNVar5;
    if (!bVar1) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}